

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_pHYs(png_structrp png_ptr,png_uint_32 x_pixels_per_unit,png_uint_32 y_pixels_per_unit
                   ,int unit_type)

{
  png_byte local_25 [4];
  png_byte apStack_21 [4];
  png_byte buf [9];
  int unit_type_local;
  png_uint_32 y_pixels_per_unit_local;
  png_uint_32 x_pixels_per_unit_local;
  png_structrp png_ptr_local;
  
  buf._1_4_ = unit_type;
  buf._5_4_ = y_pixels_per_unit;
  if (1 < unit_type) {
    png_warning(png_ptr,"Unrecognized unit type for pHYs chunk");
  }
  png_save_uint_32(local_25,x_pixels_per_unit);
  png_save_uint_32(apStack_21,buf._5_4_);
  buf[0] = (png_byte)buf._1_4_;
  png_write_complete_chunk(png_ptr,0x70485973,local_25,9);
  return;
}

Assistant:

void /* PRIVATE */
png_write_pHYs(png_structrp png_ptr, png_uint_32 x_pixels_per_unit,
    png_uint_32 y_pixels_per_unit,
    int unit_type)
{
   png_byte buf[9];

   png_debug(1, "in png_write_pHYs");

   if (unit_type >= PNG_RESOLUTION_LAST)
      png_warning(png_ptr, "Unrecognized unit type for pHYs chunk");

   png_save_uint_32(buf, x_pixels_per_unit);
   png_save_uint_32(buf + 4, y_pixels_per_unit);
   buf[8] = (png_byte)unit_type;

   png_write_complete_chunk(png_ptr, png_pHYs, buf, (png_size_t)9);
}